

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O0

RCOError __thiscall RCO::loadAttributes(RCO *this,RCOElement *el,uint32_t offset,uint32_t count)

{
  int iVar1;
  bool bVar2;
  vector<RCOAttribute,_std::allocator<RCOAttribute>_> *this_00;
  ulong uVar3;
  reference ppVar4;
  reference pRVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_RCOAttribute>,_false,_false>,_bool> pVar9;
  bool local_6f3;
  char local_6c8 [8];
  char buf_3 [256];
  char buf_2 [256];
  char buf_1 [256];
  char buf [256];
  __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
  local_2c0;
  iterator it_2;
  undefined1 local_2b0 [32];
  undefined1 local_290 [32];
  undefined1 local_270 [32];
  undefined1 local_250 [16];
  iterator it_1;
  string id;
  string local_220 [8];
  string ext;
  string local_200 [8];
  string path;
  RCOAttribute *attr_1;
  _Node_iterator_base<std::pair<const_int,_RCOAttribute>,_false> _Stack_1c8;
  int index;
  iterator end;
  iterator it;
  undefined1 local_1b0 [51];
  byte local_17d;
  bool deferred;
  __node_base local_170;
  rco_tree_table_element_attribute_raw *cur_attr;
  RCOAttribute attr;
  undefined1 local_68 [4];
  int i;
  unordered_map<int,_RCOAttribute,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_RCOAttribute>_>_>
  filedata_indexes;
  rco_tree_table_element_attribute_raw *raw_attr;
  vector<RCOAttribute,_std::allocator<RCOAttribute>_> *attributes;
  uint32_t count_local;
  uint32_t offset_local;
  RCOElement *el_local;
  RCO *this_local;
  
  this_00 = &el->attributes;
  uVar3 = SUB168(ZEXT416(count) * ZEXT816(0x10),0);
  if (SUB168(ZEXT416(count) * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  filedata_indexes._M_h._M_single_bucket = (__node_base_ptr)operator_new__(uVar3);
  memcpy(filedata_indexes._M_h._M_single_bucket,this->mBuffer + offset,(ulong)count << 4);
  std::
  unordered_map<int,_RCOAttribute,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_RCOAttribute>_>_>
  ::unordered_map((unordered_map<int,_RCOAttribute,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_RCOAttribute>_>_>
                   *)local_68);
  for (attr._244_4_ = 0; (uint)attr._244_4_ < count; attr._244_4_ = attr._244_4_ + 1) {
    RCOAttribute::RCOAttribute((RCOAttribute *)&cur_attr);
    local_170._M_nxt = filedata_indexes._M_h._M_single_bucket + (long)(int)attr._244_4_ * 2;
    attr._24_4_ = *(undefined4 *)((long)&(local_170._M_nxt)->_M_nxt + 4);
    getStringTableString(this,(string *)&cur_attr,*(uint32_t *)&(local_170._M_nxt)->_M_nxt);
    local_17d = 0;
    switch(attr._24_4_) {
    case (BADTYPE)0x1:
      attr._28_4_ = *(undefined4 *)&local_170._M_nxt[1]._M_nxt;
      break;
    case (BADTYPE)0x2:
      attr.type = *(ATTRIBUTE_TYPE *)&local_170._M_nxt[1]._M_nxt;
      break;
    case (BADTYPE)0x3:
      getStringTableString
                (this,(string *)&attr.f,*(uint32_t *)&local_170._M_nxt[1]._M_nxt,
                 *(uint32_t *)((long)&local_170._M_nxt[1]._M_nxt + 4));
      break;
    case (BADTYPE)0x4:
      getCharTableChar(this,(u16string *)&attr.field_0x48,*(uint32_t *)&local_170._M_nxt[1]._M_nxt,
                       *(uint32_t *)((long)&local_170._M_nxt[1]._M_nxt + 4));
      break;
    case (BADTYPE)0x5:
      getStyleId(this,(string *)&attr.f,*(uint32_t *)&local_170._M_nxt[1]._M_nxt);
      break;
    case (BADTYPE)0x6:
      getIntArray(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)&attr.c.field_2 + 8),*(uint32_t *)&local_170._M_nxt[1]._M_nxt,
                  *(uint32_t *)((long)&local_170._M_nxt[1]._M_nxt + 4));
      break;
    case (BADTYPE)0x7:
      getFloatArray(this,(vector<float,_std::allocator<float>_> *)
                         &attr.ia.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                    *(uint32_t *)&local_170._M_nxt[1]._M_nxt,
                    *(uint32_t *)((long)&local_170._M_nxt[1]._M_nxt + 4));
      break;
    case (BADTYPE)0x8:
      pVar9 = std::
              unordered_map<int,RCOAttribute,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,RCOAttribute>>>
              ::emplace<int&,RCOAttribute&>
                        ((unordered_map<int,RCOAttribute,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,RCOAttribute>>>
                          *)local_68,(int *)&attr.field_0xf4,(RCOAttribute *)&cur_attr);
      local_1b0._32_8_ =
           pVar9.first.super__Node_iterator_base<std::pair<const_int,_RCOAttribute>,_false>._M_cur;
      local_1b0[0x28] = pVar9.second;
      local_17d = 1;
      break;
    case (BADTYPE)0x9:
      getIdStringString(this,(string *)&attr.field_0xc8,*(uint32_t *)&local_170._M_nxt[1]._M_nxt,
                        true);
      break;
    case (BADTYPE)0xa:
      getIdStringString(this,(string *)&attr.field_0xc8,*(uint32_t *)&local_170._M_nxt[1]._M_nxt,
                        false);
      break;
    case (BADTYPE)0xb:
    case (BADTYPE)0xc:
      getIdIntInt(this,(uint32_t *)&attr.field_0xe8,*(uint32_t *)&local_170._M_nxt[1]._M_nxt);
      break;
    default:
      printf("unhandled type: %d\n",(ulong)(uint)attr._24_4_);
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cur_attr,"compress");
    local_6f3 = false;
    if (bVar2) {
      RCOAttribute::toString_abi_cxx11_((RCOAttribute *)local_1b0);
      local_6f3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1b0,"on");
      std::__cxx11::string::~string((string *)local_1b0);
    }
    if (local_6f3 == false) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cur_attr,"origsize");
      if (bVar2) {
        el->originalSize = attr._28_4_;
      }
    }
    else {
      el->isCompressed = true;
    }
    if ((local_17d & 1) == 0) {
      std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::push_back
                (this_00,(value_type *)&cur_attr);
    }
    RCOAttribute::~RCOAttribute((RCOAttribute *)&cur_attr);
  }
  end = std::
        unordered_map<int,_RCOAttribute,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_RCOAttribute>_>_>
        ::begin((unordered_map<int,_RCOAttribute,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_RCOAttribute>_>_>
                 *)local_68);
  _Stack_1c8._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_RCOAttribute,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_RCOAttribute>_>_>
       ::end((unordered_map<int,_RCOAttribute,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_RCOAttribute>_>_>
              *)local_68);
  while (bVar2 = std::__detail::operator!=
                           (&end.
                             super__Node_iterator_base<std::pair<const_int,_RCOAttribute>,_false>,
                            &stack0xfffffffffffffe38), bVar2) {
    ppVar4 = std::__detail::_Node_iterator<std::pair<const_int,_RCOAttribute>,_false,_false>::
             operator*(&end);
    iVar1 = ppVar4->first;
    ppVar4 = std::__detail::_Node_iterator<std::pair<const_int,_RCOAttribute>,_false,_false>::
             operator*(&end);
    if ((ppVar4->second).type == DATA) {
      getFileData(this,&(ppVar4->second).file,&(ppVar4->second).filelen,
                  *(uint32_t *)&filedata_indexes._M_h._M_single_bucket[(long)iVar1 * 2 + 1]._M_nxt,
                  *(uint32_t *)
                   ((long)&filedata_indexes._M_h._M_single_bucket[(long)iVar1 * 2 + 1]._M_nxt + 4),
                  (bool)(el->isCompressed & 1),el->originalSize);
    }
    std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::push_back(this_00,&ppVar4->second);
    std::__detail::_Node_iterator<std::pair<const_int,_RCOAttribute>,_false,_false>::operator++
              (&end,0);
  }
  std::__cxx11::string::string(local_200);
  std::__cxx11::string::string(local_220);
  std::__cxx11::string::string((string *)&it_1);
  bVar2 = std::operator==(&el->name,"locale");
  if (bVar2) {
    std::__cxx11::string::operator=(local_200,"xmls");
    std::__cxx11::string::operator=(local_220,"xml");
  }
  else {
    bVar2 = std::operator==(&el->name,"texture");
    if ((bVar2) || (bVar2 = std::operator==(&el->name,"override_texture"), bVar2)) {
      std::__cxx11::string::operator=(local_200,"textures");
    }
    else {
      bVar2 = std::operator==(&el->name,"sounddata");
      if (bVar2) {
        std::__cxx11::string::operator=(local_200,"sounds");
      }
      else {
        bVar2 = std::operator==(&el->name,"layout");
        if (bVar2) {
          std::__cxx11::string::operator=(local_200,"layouts");
          std::__cxx11::string::operator=(local_220,"pslayout");
        }
      }
    }
  }
  local_250._8_8_ = std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::begin(this_00);
  while( true ) {
    local_250._0_8_ = std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::end(this_00);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                        *)(local_250 + 8),
                       (__normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                        *)local_250);
    if (!bVar2) break;
    pRVar5 = __gnu_cxx::
             __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
             ::operator*((__normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                          *)(local_250 + 8));
    bVar2 = std::operator==(&pRVar5->name,"id");
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>::
      operator*((__normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                 *)(local_250 + 8));
      RCOAttribute::toString_abi_cxx11_((RCOAttribute *)local_270);
      std::__cxx11::string::operator=((string *)&it_1,(string *)local_270);
      std::__cxx11::string::~string((string *)local_270);
    }
    pRVar5 = __gnu_cxx::
             __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
             ::operator*((__normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                          *)(local_250 + 8));
    bVar2 = std::operator==(&pRVar5->name,"type");
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>::
      operator*((__normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                 *)(local_250 + 8));
      RCOAttribute::toString_abi_cxx11_((RCOAttribute *)local_2b0);
      fileExtensionFromType((RCO *)local_290,(string *)local_2b0);
      std::__cxx11::string::operator=(local_220,(string *)local_290);
      std::__cxx11::string::~string((string *)local_290);
      std::__cxx11::string::~string((string *)local_2b0);
    }
    it_2._M_current =
         (RCOAttribute *)
         __gnu_cxx::
         __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
         ::operator++((__normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                       *)(local_250 + 8),0);
  }
  local_2c0._M_current =
       (RCOAttribute *)std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::begin(this_00);
  while( true ) {
    buf._248_8_ = std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::end(this_00);
    bVar2 = __gnu_cxx::operator!=
                      (&local_2c0,
                       (__normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                        *)(buf + 0xf8));
    if (!bVar2) break;
    pRVar5 = __gnu_cxx::
             __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
             ::operator*(&local_2c0);
    bVar2 = std::operator==(&pRVar5->name,"src");
    if (bVar2) {
      uVar6 = std::__cxx11::string::c_str();
      uVar7 = std::__cxx11::string::c_str();
      uVar8 = std::__cxx11::string::c_str();
      sprintf(buf_1 + 0xf8,"%s/%s.%s",uVar6,uVar7,uVar8);
      pRVar5 = __gnu_cxx::
               __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
               ::operator*(&local_2c0);
      std::__cxx11::string::operator=((string *)&pRVar5->s,buf_1 + 0xf8);
    }
    else {
      pRVar5 = __gnu_cxx::
               __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
               ::operator*(&local_2c0);
      bVar2 = std::operator==(&pRVar5->name,"src_4k");
      if (bVar2) {
        uVar6 = std::__cxx11::string::c_str();
        uVar7 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::string::c_str();
        sprintf(buf_2 + 0xf8,"%s/%s_4k.%s",uVar6,uVar7,uVar8);
        pRVar5 = __gnu_cxx::
                 __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                 ::operator*(&local_2c0);
        std::__cxx11::string::operator=((string *)&pRVar5->s,buf_2 + 0xf8);
      }
      else {
        pRVar5 = __gnu_cxx::
                 __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                 ::operator*(&local_2c0);
        bVar2 = std::operator==(&pRVar5->name,"right");
        if (bVar2) {
          uVar6 = std::__cxx11::string::c_str();
          uVar7 = std::__cxx11::string::c_str();
          uVar8 = std::__cxx11::string::c_str();
          sprintf(buf_3 + 0xf8,"%s/%s_right.%s",uVar6,uVar7,uVar8);
          pRVar5 = __gnu_cxx::
                   __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                   ::operator*(&local_2c0);
          std::__cxx11::string::operator=((string *)&pRVar5->s,buf_3 + 0xf8);
        }
        else {
          pRVar5 = __gnu_cxx::
                   __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                   ::operator*(&local_2c0);
          bVar2 = std::operator==(&pRVar5->name,"left");
          if (bVar2) {
            uVar6 = std::__cxx11::string::c_str();
            uVar7 = std::__cxx11::string::c_str();
            uVar8 = std::__cxx11::string::c_str();
            sprintf(local_6c8,"%s/%s_left.%s",uVar6,uVar7,uVar8);
            pRVar5 = __gnu_cxx::
                     __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>
                     ::operator*(&local_2c0);
            std::__cxx11::string::operator=((string *)&pRVar5->s,local_6c8);
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<RCOAttribute_*,_std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>_>::
    operator++(&local_2c0,0);
  }
  if (filedata_indexes._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete__(filedata_indexes._M_h._M_single_bucket);
  }
  std::__cxx11::string::~string((string *)&it_1);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_200);
  std::
  unordered_map<int,_RCOAttribute,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_RCOAttribute>_>_>
  ::~unordered_map((unordered_map<int,_RCOAttribute,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_RCOAttribute>_>_>
                    *)local_68);
  return NO_ERROR;
}

Assistant:

RCOError RCO::loadAttributes(RCOElement &el, uint32_t offset, uint32_t count)
{
	std::vector<RCOAttribute> &attributes = el.attributes;

	rco_tree_table_element_attribute_raw *raw_attr = new rco_tree_table_element_attribute_raw[count];

	memcpy(raw_attr, mBuffer + offset, sizeof(rco_tree_table_element_attribute_raw) * count);

	std::unordered_map<int, RCOAttribute> filedata_indexes;

	// Handle all attributes apart from files
	for (int i = 0; i < count; i++)
	{
		RCOAttribute attr;

		rco_tree_table_element_attribute_raw &cur_attr = raw_attr[i];

		attr.type = static_cast<ATTRIBUTE_TYPE>(cur_attr.type);
		getStringTableString(attr.name, cur_attr.string_offset);

		bool deferred = false;

		switch (attr.type)
		{
		case CHAR:
			getCharTableChar(attr.c, cur_attr.c.offset, cur_attr.c.len);
			break;
		case STRING:
			getStringTableString(attr.s, cur_attr.s.offset, cur_attr.s.len);
			break;
		case ID_STR_LPB:
			getIdStringString(attr.idstr, cur_attr.id.offset, true);
			break;
		case ID_STR:
			getIdStringString(attr.idstr, cur_attr.id.offset);
			break;
		case STYLE_ID:
			getStyleId(attr.s, cur_attr.s.offset);
			break;
		case FLOAT:
			attr.f = cur_attr.f;
			break;
		case INTEGER:
			attr.i = cur_attr.i;
			break;
		case INTEGER_ARRAY:
			getIntArray(attr.ia, cur_attr.ia.offset, cur_attr.ia.num);
			break;
		case FLOAT_ARRAY:
			getFloatArray(attr.fa, cur_attr.fa.offset, cur_attr.fa.num);
			break;
		case ID_INT:
		case ID_INT_LPB:
			getIdIntInt(attr.idint, cur_attr.idref.offset);
			break;
		case DATA:
			filedata_indexes.emplace(i, attr);
			deferred = true;
			break;
		default:
			printf("unhandled type: %d\n", attr.type);
		}

		if (attr.name == "compress" && attr.toString() == "on")
			el.isCompressed = true;
		else if (attr.name == "origsize")
			el.originalSize = attr.i;

		if (!deferred)
			attributes.push_back(attr);
	}

	// Handle files afterwards (deferred)
	for (auto it = filedata_indexes.begin(), end = filedata_indexes.end(); it != end; it++)
	{
		int index = (*it).first;
		RCOAttribute &attr = (*it).second;

		if (attr.type == DATA)
		{
			getFileData(&attr.file, attr.filelen, raw_attr[index].file.offset, raw_attr[index].file.size, el.isCompressed, el.originalSize);
		}

		attributes.push_back(attr);
	}

	std::string path;
	std::string ext;
	std::string id;

	if (el.name == "locale")
	{
		path = "xmls";
		ext = "xml";
	}
	else if (el.name == "texture" || el.name == "override_texture")
	{
		path = "textures";
	}
	else if (el.name == "sounddata")
	{
		path = "sounds";
	}
	else if (el.name == "layout")
	{
		path = "layouts";
		// Just a binary file but makes sense to give it a separate ext
		ext = "pslayout";
	}

	for (auto it = attributes.begin(); it != attributes.end(); it++)
	{
		if ((*it).name == "id")
			id = (*it).toString();
		if ((*it).name == "type")
			ext = RCO::fileExtensionFromType((*it).toString());
	}

	for (auto it = attributes.begin(); it != attributes.end(); it++)
	{
		if ((*it).name == "src")
		{
			char buf[256];
			sprintf(buf, "%s/%s.%s", path.c_str(), id.c_str(), ext.c_str());
			(*it).s = buf;
		}
		else if ((*it).name == "src_4k")
		{
			char buf[256];
			sprintf(buf, "%s/%s_4k.%s", path.c_str(), id.c_str(), ext.c_str());
			(*it).s = buf;
		}
		else if ((*it).name == "right")
		{
			char buf[256];
			sprintf(buf, "%s/%s_right.%s", path.c_str(), id.c_str(), ext.c_str());
			(*it).s = buf;
		}
		else if ((*it).name == "left")
		{
			char buf[256];
			sprintf(buf, "%s/%s_left.%s", path.c_str(), id.c_str(), ext.c_str());
			(*it).s = buf;
		}
	}

	delete[] raw_attr;

	return NO_ERROR;
}